

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O0

void Ssc_ManStartSolver(Ssc_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar3;
  sat_solver *s;
  bool bVar4;
  int iObj;
  int status;
  int i;
  sat_solver *pSat;
  Gia_Obj_t *pObj;
  Cnf_Dat_t *pDat;
  Aig_Man_t *pMan;
  Ssc_Man_t *p_local;
  
  pAig = Gia_ManToAigSimple(p->pFraig);
  p_00 = Cnf_Derive(pAig,0);
  if ((p->pSat == (sat_solver *)0x0) && (p->vId2Var == (Vec_Int_t *)0x0)) {
    iVar1 = Aig_ManObjNumMax(pAig);
    iVar2 = Gia_ManObjNum(p->pFraig);
    if (iVar1 != iVar2) {
      __assert_fail("Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                    ,0x10d,"void Ssc_ManStartSolver(Ssc_Man_t *)");
    }
    Aig_ManStop(pAig);
    iVar1 = p_00->nVars;
    p->nSatVars = iVar1;
    p->nSatVarsPivot = iVar1;
    iVar1 = Gia_ManCandNum(p->pAig);
    iVar2 = Gia_ManCandNum(p->pCare);
    pVVar3 = Vec_IntStart(iVar1 + iVar2 + 10);
    p->vId2Var = pVVar3;
    iVar1 = Gia_ManCandNum(p->pAig);
    iVar2 = Gia_ManCandNum(p->pCare);
    pVVar3 = Vec_IntStart(iVar1 + iVar2 + 10);
    p->vVar2Id = pVVar3;
    Ssc_ObjSetSatVar(p,0,*p_00->pVarNums);
    iObj = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->pFraig->vCis);
      bVar4 = false;
      if (iObj < iVar1) {
        pSat = (sat_solver *)Gia_ManCi(p->pFraig,iObj);
        bVar4 = pSat != (sat_solver *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjId(p->pFraig,(Gia_Obj_t *)pSat);
      Ssc_ObjSetSatVar(p,iVar1,p_00->pVarNums[iVar1]);
      iObj = iObj + 1;
    }
    s = sat_solver_new();
    sat_solver_setnvars(s,p_00->nVars + 1000);
    iObj = 0;
    while( true ) {
      if (p_00->nClauses <= iObj) {
        Cnf_DataFree(p_00);
        iVar1 = sat_solver_simplify(s);
        if (iVar1 == 0) {
          sat_solver_delete(s);
        }
        else {
          p->pSat = s;
        }
        return;
      }
      iVar1 = sat_solver_addclause(s,p_00->pClauses[iObj],p_00->pClauses[iObj + 1]);
      if (iVar1 == 0) break;
      iObj = iObj + 1;
    }
    Cnf_DataFree(p_00);
    sat_solver_delete(s);
    return;
  }
  __assert_fail("p->pSat == NULL && p->vId2Var == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                ,0x10c,"void Ssc_ManStartSolver(Ssc_Man_t *)");
}

Assistant:

void Ssc_ManStartSolver( Ssc_Man_t * p )
{
    Aig_Man_t * pMan = Gia_ManToAigSimple( p->pFraig );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, 0 );
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, status;
    assert( p->pSat == NULL && p->vId2Var == NULL );
    assert( Aig_ManObjNumMax(pMan) == Gia_ManObjNum(p->pFraig) );
    Aig_ManStop( pMan );
    // save variable mapping
    p->nSatVarsPivot = p->nSatVars = pDat->nVars;
    p->vId2Var = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each node into its SAT var
    p->vVar2Id = Vec_IntStart( Gia_ManCandNum(p->pAig) + Gia_ManCandNum(p->pCare) + 10 ); // mapping of each SAT var into its node
    Ssc_ObjSetSatVar( p, 0, pDat->pVarNums[0] );
    Gia_ManForEachCi( p->pFraig, pObj, i )
    {
        int iObj = Gia_ObjId( p->pFraig, pObj );
        Ssc_ObjSetSatVar( p, iObj, pDat->pVarNums[iObj] );
    }
//Cnf_DataWriteIntoFile( pDat, "dump.cnf", 1, NULL, NULL );
    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars + 1000 );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            return;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        return;
    }
    p->pSat = pSat;
}